

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkBeamIGAslider.cpp
# Opt level: O2

void __thiscall chrono::fea::ChLinkBeamIGAslider::UpdateNodes(ChLinkBeamIGAslider *this)

{
  pointer psVar1;
  element_type *peVar2;
  pointer psVar3;
  undefined1 auVar4 [16];
  long *plVar5;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  *__x;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> *i;
  pointer psVar6;
  size_t iel;
  ulong uVar7;
  int ip;
  int iVar8;
  double dVar9;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> mvars;
  int nnodes;
  ChVectorDynamic<> N;
  ChVector<double> absoutlet;
  _Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_108;
  double local_e8;
  double local_e0;
  ChVariables *local_d8;
  size_t *local_d0;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  *local_c8;
  double local_c0;
  double local_b8;
  int local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  double local_98;
  Matrix<double,__1,_1,_0,__1,_1> local_88;
  _Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_78;
  _Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_60;
  undefined1 local_48 [16];
  double local_38;
  
  local_c8 = &this->m_nodes;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::clear(local_c8);
  plVar5 = (long *)(**(code **)(*(long *)&((((this->m_beams).
                                             super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super___shared_ptr<chrono::fea::ChElementBeamIGA,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_ptr)->super_ChElementBeam + 0xd0))();
  this->order = (int)((ulong)(plVar5[1] - *plVar5) >> 4) + -1;
  this->active_element = 0;
  this->tau = 0.0;
  local_ac = (int)((ulong)((long)(this->m_nodes).
                                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_nodes).
                                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4);
  local_a8 = VNULL;
  uStack_a0 = DAT_011dd3e0;
  local_98 = DAT_011dd3e8;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_88,&local_ac);
  ChFrame<double>::TransformPointLocalToParent
            ((ChVector<double> *)local_48,
             (ChFrame<double> *)
             (this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,&(this->m_csys).pos);
  local_d0 = &this->active_element;
  local_e0 = 1e+30;
  for (uVar7 = 0;
      psVar1 = (this->m_beams).
               super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)(this->m_beams).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4);
      uVar7 = uVar7 + 1) {
    local_e8 = ChElementBeamIGA::GetU1
                         (psVar1[uVar7].
                          super___shared_ptr<chrono::fea::ChElementBeamIGA,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr);
    local_c0 = ChElementBeamIGA::GetU2
                         ((this->m_beams).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar7].
                          super___shared_ptr<chrono::fea::ChElementBeamIGA,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr);
    local_c0 = local_c0 - local_e8;
    for (iVar8 = 0; iVar8 != 6; iVar8 = iVar8 + 1) {
      peVar2 = (this->m_beams).
               super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar7].
               super___shared_ptr<chrono::fea::ChElementBeamIGA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_b8 = local_e8 + (local_c0 * (double)iVar8) / 5.0;
      (**(code **)(*(long *)&peVar2->super_ChElementBeam + 0xe8))
                (((local_b8 - local_e8) + (local_b8 - local_e8)) / local_c0 + -1.0,peVar2,&local_a8)
      ;
      auVar4._8_8_ = uStack_a0;
      auVar4._0_8_ = local_a8;
      local_108._M_impl.super__Vector_impl_data._0_16_ = vsubpd_avx(auVar4,local_48);
      local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(local_98 - local_38);
      dVar9 = ChVector<double>::Length((ChVector<double> *)&local_108);
      if (dVar9 < local_e0) {
        this->tau = local_b8;
        this->active_element = uVar7;
        local_e0 = dVar9;
      }
    }
  }
  __x = (vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
         *)(**(code **)(*(long *)&(psVar1[*local_d0].
                                   super___shared_ptr<chrono::fea::ChElementBeamIGA,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->super_ChElementBeam + 0xd0))();
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::operator=(local_c8,__x);
  local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
  psVar3 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (this->m_nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar3; psVar6 = psVar6 + 1) {
    iVar8 = (*(((psVar6->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
               )->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[8])();
    local_d8 = (ChVariables *)CONCAT44(extraout_var,iVar8);
    std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
    emplace_back<chrono::ChVariables*>
              ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_108,
               &local_d8);
  }
  iVar8 = (*(((this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  local_d8 = (ChVariables *)CONCAT44(extraout_var_00,iVar8);
  std::vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>>::
  emplace_back<chrono::ChVariables*>
            ((vector<chrono::ChVariables*,std::allocator<chrono::ChVariables*>> *)&local_108,
             &local_d8);
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
            ((vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)&local_60,
             (vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)&local_108);
  ChConstraintNgeneric::SetVariables
            (&this->constraint2,
             (vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)&local_60);
  std::_Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~_Vector_base
            (&local_60);
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
            ((vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)&local_78,
             (vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)&local_108);
  ChConstraintNgeneric::SetVariables
            (&this->constraint3,
             (vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)&local_78);
  std::_Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~_Vector_base
            (&local_78);
  std::_Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~_Vector_base
            (&local_108);
  Eigen::internal::handmade_aligned_free
            (local_88.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
  return;
}

Assistant:

void ChLinkBeamIGAslider::UpdateNodes() {
    m_nodes.clear();

    this->order = (int)m_beams[0]->GetNodes().size() - 1;

    // fetch the element and the tau
    this->tau = 0;
    this->active_element = 0;
    int nnodes = (int)this->m_nodes.size();
    ChVector<> point = VNULL;
    ChVector<> goodpoint = VNULL;
    ChVectorDynamic<> N(nnodes);
    int nsamples = 6;  //***TODO*** search via NR
    double mdist = 1e30;
    ChVector<> absoutlet = this->m_body->TransformPointLocalToParent(this->m_csys.pos);

    for (size_t iel = 0; iel < m_beams.size(); ++iel) {
        double u1 = m_beams[iel]->GetU1();
        double u2 = m_beams[iel]->GetU2();

        for (int ip = 0; ip < nsamples; ++ip) {
            double u = u1 + (u2 - u1) * (double)ip / ((double)(nsamples - 1));
            double eta = (2.0 * (u - u1) / (u2 - u1)) - 1.0;
            m_beams[iel]->EvaluateSectionPoint(eta, point);

            double trydist = (point - absoutlet).Length();
            if (trydist < mdist) {
                mdist = trydist;
                this->tau = u;
                this->active_element = iel;
                goodpoint = point;
            }
        }
    }
    //***TEST
    // double u1 = m_beams[this->active_element]->GetU1();
    // double u2 = m_beams[this->active_element]->GetU2();
    // double eta = (2.0*(this->tau - u1) / (u2 - u1)) - 1.0;
    // m_beams[this->active_element]->EvaluateSectionPoint(eta, point);
    // GetLog() << "Update tau=" << this->tau << " eta=" << eta << " dist=" << mdist << " elem n." <<
    // this->active_element << " on " << m_beams.size() << " pos=" << goodpoint << " outlet=" << absoutlet << "\n";

    m_nodes = m_beams[this->active_element]->GetNodes();

    // update variables pointers
    std::vector<ChVariables*> mvars;
    for (auto& i : this->m_nodes) {
        mvars.push_back(&(i->Variables()));
    }
    mvars.push_back(&(m_body->Variables()));

    // constraint1.SetVariables(mvars);
    constraint2.SetVariables(mvars);
    constraint3.SetVariables(mvars);
}